

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_avx2.c
# Opt level: O3

void av1_calc_indices_dim2_avx2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  int iVar7;
  long lVar8;
  undefined4 uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  bool bVar12;
  undefined1 (*pauVar13) [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  __m256i cents [8];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [272];
  
  if (0 < k) {
    lVar8 = 0;
    do {
      uVar9 = *(undefined4 *)((long)centroids + lVar8);
      lVar1 = lVar8 * 8;
      *(undefined4 *)(local_160 + lVar1) = uVar9;
      *(undefined4 *)(local_160 + lVar1 + 4) = uVar9;
      *(undefined4 *)(local_160 + lVar1 + 8) = uVar9;
      *(undefined4 *)(local_160 + lVar1 + 0xc) = uVar9;
      *(undefined4 *)(local_160 + lVar1 + 0x10) = uVar9;
      *(undefined4 *)(local_140 + lVar1 + -0xc) = uVar9;
      *(undefined4 *)(local_140 + lVar1 + -8) = uVar9;
      *(undefined4 *)(local_140 + lVar1 + -4) = uVar9;
      lVar8 = lVar8 + 4;
    } while ((ulong)(uint)k * 4 - lVar8 != 0);
  }
  if (n < 1) {
    auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    iVar7 = 0;
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    do {
      pauVar13 = &local_180;
      bVar6 = true;
      do {
        bVar12 = bVar6;
        auVar14 = *(undefined1 (*) [32])data;
        auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        *pauVar13 = auVar16;
        auVar17 = vpsubw_avx2(auVar14,local_160);
        auVar17 = vpmaddwd_avx2(auVar17,auVar17);
        if (1 < k) {
          auVar18 = ZEXT1664((undefined1  [16])0x0);
          uVar10 = 1;
          pauVar11 = (undefined1 (*) [32])local_140;
          do {
            auVar5 = vpsubw_avx2(auVar14,*pauVar11);
            auVar4 = vpmaddwd_avx2(auVar5,auVar5);
            auVar5 = vpcmpgtd_avx2(auVar17,auVar4);
            auVar17 = vpminsd_avx2(auVar17,auVar4);
            uVar9 = (undefined4)uVar10;
            auVar19._4_4_ = uVar9;
            auVar19._0_4_ = uVar9;
            auVar19._8_4_ = uVar9;
            auVar19._12_4_ = uVar9;
            auVar19._16_4_ = uVar9;
            auVar19._20_4_ = uVar9;
            auVar19._24_4_ = uVar9;
            auVar19._28_4_ = uVar9;
            auVar4 = vpandn_avx2(auVar5,auVar18._0_32_);
            auVar5 = vpand_avx2(auVar5,auVar19);
            auVar5 = vpor_avx2(auVar4,auVar5);
            auVar18 = ZEXT3264(auVar5);
            uVar10 = uVar10 + 1;
            pauVar11 = pauVar11 + 1;
          } while ((uint)k != uVar10);
          *pauVar13 = auVar5;
        }
        if (total_dist != (int64_t *)0x0) {
          auVar14 = vpunpckldq_avx2(auVar17,auVar16);
          auVar17 = vpunpckhdq_avx2(auVar17,auVar16);
          auVar14 = vpaddq_avx2(auVar15._0_32_,auVar14);
          auVar14 = vpaddq_avx2(auVar14,auVar17);
          auVar15 = ZEXT3264(auVar14);
        }
        auVar14 = auVar15._0_32_;
        data = (int16_t *)((long)data + 0x20);
        pauVar13 = &local_1a0;
        bVar6 = false;
      } while (bVar12);
      auVar17 = vpackusdw_avx2(local_180,local_1a0);
      auVar17 = vpackuswb_avx2(auVar17,auVar14);
      auVar3 = vpunpckldq_avx(auVar17._0_16_,auVar17._16_16_);
      *(undefined1 (*) [16])indices = auVar3;
      indices = (uint8_t *)((long)indices + 0x10);
      iVar7 = iVar7 + 0x10;
    } while (iVar7 < n);
  }
  if (total_dist != (int64_t *)0x0) {
    auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
    auVar2 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar2,auVar3);
    *total_dist = auVar3._0_8_;
  }
  return;
}

Assistant:

void av1_calc_indices_dim2_avx2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m256i v_zero = _mm256_setzero_si256();
  const __m256i permute = _mm256_set_epi32(0, 0, 0, 0, 5, 1, 4, 0);
  __m256i sum = _mm256_setzero_si256();
  __m256i ind[2];
  __m256i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    const int16_t cx = centroids[2 * j], cy = centroids[2 * j + 1];
    cents[j] = _mm256_set_epi16(cy, cx, cy, cx, cy, cx, cy, cx, cy, cx, cy, cx,
                                cy, cx, cy, cx);
  }

  for (int i = 0; i < n; i += 16) {
    for (int l = 0; l < 2; ++l) {
      const __m256i in = _mm256_loadu_si256((__m256i *)data);
      ind[l] = _mm256_setzero_si256();
      // Compute the distance to the first centroid.
      __m256i d1 = _mm256_sub_epi16(in, cents[0]);
      __m256i dist_min = _mm256_madd_epi16(d1, d1);

      for (int j = 1; j < k; ++j) {
        // Compute the distance to the centroid.
        d1 = _mm256_sub_epi16(in, cents[j]);
        const __m256i dist = _mm256_madd_epi16(d1, d1);
        // Compare to the minimal one.
        const __m256i cmp = _mm256_cmpgt_epi32(dist_min, dist);
        dist_min = _mm256_min_epi32(dist_min, dist);
        const __m256i ind1 = _mm256_set1_epi32(j);
        ind[l] = _mm256_or_si256(_mm256_andnot_si256(cmp, ind[l]),
                                 _mm256_and_si256(cmp, ind1));
      }
      if (total_dist) {
        // Convert to 64 bit and add to sum.
        const __m256i dist1 = _mm256_unpacklo_epi32(dist_min, v_zero);
        const __m256i dist2 = _mm256_unpackhi_epi32(dist_min, v_zero);
        sum = _mm256_add_epi64(sum, dist1);
        sum = _mm256_add_epi64(sum, dist2);
      }
      data += 16;
    }
    // Cast to 8 bit and store.
    const __m256i d2 = _mm256_packus_epi32(ind[0], ind[1]);
    const __m256i d3 = _mm256_packus_epi16(d2, v_zero);
    const __m256i d4 = _mm256_permutevar8x32_epi32(d3, permute);
    const __m128i d5 = _mm256_extracti128_si256(d4, 0);
    _mm_storeu_si128((__m128i *)indices, d5);
    indices += 16;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_avx2(sum);
  }
}